

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGridSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float *pfVar4;
  pointer pvVar5;
  Vec3fa *ptr;
  undefined8 uVar6;
  GridMeshNode *this_00;
  Vec3fa *pVVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  size_t i_1;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar25;
  float fVar26;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar27;
  float fVar28;
  Ref<embree::SceneGraph::MaterialNode> local_78;
  Grid local_6c;
  Node *local_60;
  long local_58;
  GridMeshNode *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_60 = (Node *)this;
  local_48 = radius;
  this_00 = (GridMeshNode *)::operator_new(0xa8);
  local_78 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  local_50 = this_00;
  if (local_78.ptr != (MaterialNode *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  GridMeshNode::GridMeshNode(this_00,&local_78,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_78.ptr != (MaterialNode *)0x0) {
    (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar1 = N + 1;
  local_58 = uVar1 * uVar1;
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = local_58 * 6;
  uVar11 = pvVar5->size_alloced;
  uVar15 = uVar11;
  if ((uVar11 < uVar10) && (uVar13 = uVar11, uVar15 = uVar10, uVar11 != 0)) {
    for (; uVar15 = uVar13, uVar13 < uVar10; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
    }
  }
  if (uVar10 < pvVar5->size_active) {
    pvVar5->size_active = uVar10;
  }
  if (uVar11 == uVar15) {
    pvVar5->size_active = uVar10;
  }
  else {
    ptr = pvVar5->items;
    pVVar7 = (Vec3fa *)alignedMalloc(uVar15 << 4,0x10);
    pvVar5->items = pVVar7;
    lVar8 = 0;
    for (uVar11 = 0; uVar11 < pvVar5->size_active; uVar11 = uVar11 + 1) {
      puVar2 = (undefined8 *)((long)&ptr->field_0 + lVar8);
      uVar6 = puVar2[1];
      puVar3 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar8);
      *puVar3 = *puVar2;
      puVar3[1] = uVar6;
      lVar8 = lVar8 + 0x10;
    }
    alignedFree(ptr);
    pvVar5->size_active = uVar10;
    pvVar5->size_alloced = uVar15;
  }
  local_50 = (GridMeshNode *)&local_50->grids;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  lVar8 = local_58 * 0x10;
  lVar14 = 0;
  for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
    local_6c.startVtx = (int)lVar16 * (int)local_58;
    local_6c.lineStride = (uint)uVar1;
    local_6c.resX = (unsigned_short)uVar1;
    local_6c.resY = local_6c.resX;
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::emplace_back<embree::SceneGraph::GridMeshNode::Grid>
              ((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                *)local_50,&local_6c);
    lVar9 = lVar14;
    for (uVar11 = 0; uVar11 != uVar1; uVar11 = uVar11 + 1) {
      fVar17 = (float)uVar11 / (float)N;
      lVar12 = lVar9;
      for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
        fVar18 = (float)uVar15 / (float)N;
        fVar19 = fVar18 * 1.0 + -0.5 + fVar17 * 0.0;
        fVar20 = fVar18 * 0.0 + -0.5 + fVar17 * 1.0;
        fVar21 = fVar18 * 0.0 + -0.5 + fVar17 * 0.0;
        fVar22 = fVar18 * 0.0 + 0.0 + fVar17 * 0.0;
        fVar18 = fVar20 * fVar20;
        fVar25 = fVar21 * fVar21;
        fVar26 = fVar22 * fVar22;
        fVar27 = fVar18 + fVar19 * fVar19 + fVar25;
        fVar28 = fVar18 + fVar18 + fVar26;
        fVar25 = fVar18 + fVar25 + fVar25;
        fVar26 = fVar18 + fVar26 + fVar26;
        auVar23._4_4_ = fVar28;
        auVar23._0_4_ = fVar27;
        auVar23._8_4_ = fVar25;
        auVar23._12_4_ = fVar26;
        auVar24._4_4_ = fVar28;
        auVar24._0_4_ = fVar27;
        auVar24._8_4_ = fVar25;
        auVar24._12_4_ = fVar26;
        auVar24 = rsqrtss(auVar23,auVar24);
        fVar18 = auVar24._0_4_;
        fVar27 = fVar18 * fVar18 * fVar27 * -0.5 * fVar18 + fVar18 * 1.5;
        fVar18 = (center->field_0).m128[1];
        fVar25 = (center->field_0).m128[2];
        fVar26 = (center->field_0).m128[3];
        pfVar4 = (float *)((long)&((this_00->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->items->field_0 +
                          lVar12);
        *pfVar4 = fVar27 * fVar19 * local_48 + (center->field_0).m128[0];
        pfVar4[1] = fVar27 * fVar20 * fStack_44 + fVar18;
        pfVar4[2] = fVar27 * fVar21 * fStack_40 + fVar25;
        pfVar4[3] = fVar27 * fVar22 * fStack_3c + fVar26;
        lVar12 = lVar12 + 0x10;
      }
      lVar9 = lVar9 + N * 0x10 + 0x10;
    }
    lVar14 = lVar14 + lVar8;
  }
  (local_60->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_60;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGridSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    size_t grid_size = (N+1)*(N+1);
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(grid_size*6);

    for (size_t i=0; i<6; i++)
    {
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(unsigned(i*grid_size),unsigned(N+1),unsigned(N+1),unsigned(N+1)));
      Vec3fa p0, dx, dy;
      switch (i) {
      case 0: p0 = Vec3fa(-0.5f,-0.5f,-0.5f); dx = Vec3fa(+1,0, 0); dy = Vec3fa(0,1,0); break;
      case 1: p0 = Vec3fa(+0.5f,-0.5f,-0.5f); dx = Vec3fa( 0,0,+1); dy = Vec3fa(0,1,0); break;
      case 2: p0 = Vec3fa(+0.5f,-0.5f,+0.5f); dx = Vec3fa(-1,0, 0); dy = Vec3fa(0,1,0); break;
      case 3: p0 = Vec3fa(-0.5f,-0.5f,+0.5f); dx = Vec3fa( 0,0,-1); dy = Vec3fa(0,1,0); break;
      case 4: p0 = Vec3fa(-0.5f,-0.5f,-0.5f); dx = Vec3fa( 0,0,+1); dy = Vec3fa(1,0,0); break;
      case 5: p0 = Vec3fa(-0.5f,+0.5f,-0.5f); dx = Vec3fa( 1,0, 0); dy = Vec3fa(0,0,1); break;
      default: assert(false);
      }
      
      for (size_t y=0; y<=N; y++) {
        for (size_t x=0; x<=N; x++) {
          size_t j = i*grid_size + y*(N+1) + x;
          Vec3fa p = p0+float(x)/float(N)*dx+float(y)/float(N)*dy;
          mesh->positions[0][j] = center + radius*normalize(p);
        }
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }